

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix.c
# Opt level: O0

int Test_SUNMatSpace(SUNMatrix A,int myid)

{
  uint in_ESI;
  SUNMatrix in_RDI;
  long leniw;
  long lenrw;
  double stop_time;
  double start_time;
  int failure;
  undefined8 local_38;
  undefined8 local_30;
  double local_28;
  double local_20;
  int local_18;
  uint local_14;
  SUNMatrix local_10;
  int local_4;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_20 = get_time();
  local_18 = SUNMatSpace(local_10,&local_30,&local_38);
  sync_device(local_10);
  local_28 = get_time();
  if (local_18 == 0) {
    if ((print_all_ranks == 0) && (local_14 == 0)) {
      printf("    PASSED test -- SUNMatSpace lenrw=%li ",local_30);
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)local_14);
      printf("    PASSED test -- SUNMatSpace lenrw=%li ",local_30);
    }
    if ((print_all_ranks == 0) && (local_14 == 0)) {
      printf("leniw=%li\n",local_38);
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)local_14);
      printf("leniw=%li\n",local_38);
    }
    if ((local_14 == 0) && (print_time != 0)) {
      printf("    SUNMatSpace Time: %22.15e \n \n",local_28 - local_20);
    }
    local_4 = 0;
  }
  else {
    if ((print_all_ranks == 0) && (local_14 == 0)) {
      printf(">>> FAILED test -- SUNMatSpace \n");
    }
    else if (print_all_ranks != 0) {
      printf("process %06d: ",(ulong)local_14);
      printf(">>> FAILED test -- SUNMatSpace \n");
    }
    if (print_time != 0) {
      printf("    SUNMatSpace Time: %22.15e \n \n",local_28 - local_20);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNMatSpace(SUNMatrix A, int myid)
{
  int failure;
  double start_time, stop_time;
  long int lenrw, leniw;

  start_time = get_time();
  failure    = SUNMatSpace(A, &lenrw, &leniw);
  sync_device(A);
  stop_time = get_time();

  if (failure)
  {
    TEST_STATUS(">>> FAILED test -- SUNMatSpace \n", myid);
    PRINT_TIME("    SUNMatSpace Time: %22.15e \n \n", stop_time - start_time);
    return (1);
  }
  else
  {
    TEST_STATUS2("    PASSED test -- SUNMatSpace lenrw=%li ", lenrw, myid);
    TEST_STATUS2("leniw=%li\n", leniw, myid);
  }

  if (myid == 0)
  {
    PRINT_TIME("    SUNMatSpace Time: %22.15e \n \n", stop_time - start_time);
  }

  return (0);
}